

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O3

int ffiimgll(fitsfile *fptr,int bitpix,int naxis,LONGLONG *naxes,int *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  LONGLONG *pLVar7;
  long lVar8;
  FITSfile *pFVar9;
  LONGLONG LVar10;
  int onaxis;
  char naxiskey [75];
  char errmsg [81];
  
  iVar4 = *status;
  if (0 < iVar4) {
    return iVar4;
  }
  pFVar9 = fptr->Fptr;
  if (fptr->HDUposition != pFVar9->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar9 = fptr->Fptr;
    iVar4 = *status;
  }
  if (iVar4 != -9) {
    if ((pFVar9->headend == pFVar9->headstart[pFVar9->curhdu]) ||
       ((pFVar9->curhdu == pFVar9->maxhdu &&
        (pFVar9->logfilesize <= pFVar9->headstart[(long)pFVar9->maxhdu + 1])))) {
      ffcrimll(fptr,bitpix,naxis,naxes,status);
      goto LAB_00141d8f;
    }
  }
  if (bitpix < 0x10) {
    if (bitpix == -0x40) {
LAB_00141dc8:
      lVar8 = 8;
    }
    else if (bitpix == -0x20) {
LAB_00141dcf:
      lVar8 = 4;
    }
    else {
      lVar8 = 1;
      if (bitpix != 8) {
LAB_00141f07:
        snprintf(errmsg,0x51,"Illegal value for BITPIX keyword: %d",(ulong)(uint)bitpix);
        ffpmsg(errmsg);
        *status = 0xd3;
        return 0xd3;
      }
    }
  }
  else {
    if (bitpix == 0x40) goto LAB_00141dc8;
    if (bitpix == 0x20) goto LAB_00141dcf;
    if (bitpix != 0x10) goto LAB_00141f07;
    lVar8 = 2;
  }
  if (999 < (uint)naxis) {
    snprintf(errmsg,0x51,"Illegal value for NAXIS keyword: %d",(ulong)(uint)naxis);
    ffpmsg(errmsg);
    *status = 0xd4;
    return 0xd4;
  }
  if (naxis == 0) {
LAB_00141e4f:
    lVar5 = 0;
  }
  else {
    uVar6 = 0;
    do {
      if (naxes[uVar6] < 0) {
        snprintf(errmsg,0x51,"Illegal value for NAXIS%d keyword: %ld",(ulong)((int)uVar6 + 1));
        ffpmsg(errmsg);
        *status = 0xd5;
        return 0xd5;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)naxis != uVar6);
    if (naxis == 0) goto LAB_00141e4f;
    lVar5 = *naxes;
    if (1 < naxis) {
      uVar6 = 1;
      do {
        lVar5 = lVar5 * naxes[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)naxis != uVar6);
    }
  }
  if (pFVar9->writemode != 1) {
    *status = 0x70;
    return 0x70;
  }
  lVar8 = (lVar5 * lVar8 + 0xb3f) / 0xb40 + 1;
  ffrdef(fptr,status);
  ffpdfl(fptr,status);
  if (*status == -9) {
    *status = 0;
    ffmahd(fptr,1,(int *)0x0,status);
    ffgidm(fptr,&onaxis,status);
    if (onaxis < 1) {
      builtin_strncpy(naxiskey,"NAXIS",6);
    }
    else {
      ffkeyn("NAXIS",onaxis,naxiskey,status);
    }
    ffgcrd(fptr,naxiskey,errmsg,status);
    ffikyj(fptr,"PCOUNT",0,"required keyword",status);
    ffikyj(fptr,"GCOUNT",1,"required keyword",status);
    if (0 < *status) {
      return *status;
    }
    iVar4 = ffdkey(fptr,"EXTEND",status);
    if (iVar4 != 0) {
      *status = 0;
    }
    ffrdef(fptr,status);
    iVar4 = ffiblk(fptr,lVar8,-1,status);
    if (0 < iVar4) goto LAB_00141d8f;
    iVar4 = 0;
    LVar10 = 0;
  }
  else {
    pFVar9 = fptr->Fptr;
    iVar4 = pFVar9->curhdu;
    LVar10 = pFVar9->headstart[(long)iVar4 + 1];
    pFVar9->hdutype = 0;
    iVar3 = ffiblk(fptr,lVar8,1,status);
    if (0 < iVar3) goto LAB_00141d8f;
    iVar4 = iVar4 + 1;
  }
  pFVar9 = fptr->Fptr;
  iVar1 = pFVar9->maxhdu;
  iVar3 = iVar1 + 1;
  pFVar9->maxhdu = iVar3;
  iVar2 = pFVar9->curhdu;
  if (iVar2 <= iVar1) {
    pLVar7 = pFVar9->headstart;
    lVar5 = (long)iVar3;
    do {
      pLVar7[lVar5 + 1] = pLVar7[lVar5];
      lVar5 = lVar5 + -1;
    } while (iVar2 < lVar5);
  }
  if (iVar4 == 0) {
    pLVar7 = pFVar9->headstart;
    pLVar7[1] = lVar8 * 0xb40;
  }
  else {
    pLVar7 = pFVar9->headstart;
  }
  pLVar7[iVar4] = LVar10;
  pFVar9->curhdu = iVar4;
  fptr->HDUposition = iVar4;
  pFVar9->nextkey = LVar10;
  lVar8 = pLVar7[iVar4];
  pFVar9->headend = lVar8;
  pFVar9->datastart = lVar8 + 0xb40;
  pFVar9->hdutype = 0;
  ffphprll(fptr,1,bitpix,naxis,naxes,0,1,1,status);
  ffrdef(fptr,status);
LAB_00141d8f:
  return *status;
}

Assistant:

int ffiimgll(fitsfile *fptr,    /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           LONGLONG *naxes,     /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
  insert an IMAGE extension following the current HDU 
*/
{
    int bytlen, nexthdu, maxhdu, ii, onaxis;
    long nblocks;
    LONGLONG npixels, newstart, datasize;
    char errmsg[FLEN_ERRMSG], card[FLEN_CARD], naxiskey[FLEN_KEYWORD];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    maxhdu = (fptr->Fptr)->maxhdu;

    if (*status != PREPEND_PRIMARY)
    {
      /* if the current header is completely empty ...  */
      if (( (fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])
        /* or, if we are at the end of the file, ... */
      ||  ( (((fptr->Fptr)->curhdu) == maxhdu ) &&
       ((fptr->Fptr)->headstart[maxhdu + 1] >= (fptr->Fptr)->logfilesize ) ) )
      {
        /* then simply append new image extension */
        ffcrimll(fptr, bitpix, naxis, naxes, status);
        return(*status);
      }
    }

    if (bitpix == 8)
        bytlen = 1;
    else if (bitpix == 16)
        bytlen = 2;
    else if (bitpix == 32 || bitpix == -32)
        bytlen = 4;
    else if (bitpix == 64 || bitpix == -64)
        bytlen = 8;
    else
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for BITPIX keyword: %d", bitpix);
        ffpmsg(errmsg);
        return(*status = BAD_BITPIX);  /* illegal bitpix value */
    }
    if (naxis < 0 || naxis > 999)
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(errmsg);
        return(*status = BAD_NAXIS);
    }

    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(errmsg, FLEN_ERRMSG,
            "Illegal value for NAXIS%d keyword: %ld", ii + 1,  (long) naxes[ii]);
            ffpmsg(errmsg);
            return(*status = BAD_NAXES);
        }
    }

    /* calculate number of pixels in the image */
    if (naxis == 0)
        npixels = 0;
    else 
        npixels = naxes[0];

    for (ii = 1; ii < naxis; ii++)
        npixels = npixels * naxes[ii];

    datasize = npixels * bytlen;          /* size of image in bytes */
    nblocks = (long) (((datasize + 2879) / 2880) + 1);  /* +1 for the header */

    if ((fptr->Fptr)->writemode == READWRITE) /* must have write access */
    {   /* close the CHDU */
        ffrdef(fptr, status);  /* scan header to redefine structure */
        ffpdfl(fptr, status);  /* insure correct data file values */
    }
    else
        return(*status = READONLY_FILE);

    if (*status == PREPEND_PRIMARY)
    {
        /* inserting a new primary array; the current primary */
        /* array must be transformed into an image extension. */

        *status = 0;   
        ffmahd(fptr, 1, NULL, status);  /* move to the primary array */

        ffgidm(fptr, &onaxis, status);
        if (onaxis > 0)
            ffkeyn("NAXIS",onaxis, naxiskey, status);
        else
            strcpy(naxiskey, "NAXIS");

        ffgcrd(fptr, naxiskey, card, status);  /* read last NAXIS keyword */
        
        ffikyj(fptr, "PCOUNT", 0, "required keyword", status); /* add PCOUNT and */
        ffikyj(fptr, "GCOUNT", 1, "required keyword", status); /* GCOUNT keywords */

        if (*status > 0)
            return(*status);

        if (ffdkey(fptr, "EXTEND", status) ) /* delete the EXTEND keyword */
            *status = 0;

        /* redefine internal structure for this HDU */
        ffrdef(fptr, status);


        /* insert space for the primary array */
        if (ffiblk(fptr, nblocks, -1, status) > 0)  /* insert the blocks */
            return(*status);

        nexthdu = 0;  /* number of the new hdu */
        newstart = 0; /* starting addr of HDU */
    }
    else
    {
        nexthdu = ((fptr->Fptr)->curhdu) + 1; /* number of the next (new) hdu */
        newstart = (fptr->Fptr)->headstart[nexthdu]; /* save starting addr of HDU */

        (fptr->Fptr)->hdutype = IMAGE_HDU;  /* so that correct fill value is used */
        /* ffiblk also increments headstart for all following HDUs */
        if (ffiblk(fptr, nblocks, 1, status) > 0)  /* insert the blocks */
            return(*status);
    }

    ((fptr->Fptr)->maxhdu)++;      /* increment known number of HDUs in the file */
    for (ii = (fptr->Fptr)->maxhdu; ii > (fptr->Fptr)->curhdu; ii--)
        (fptr->Fptr)->headstart[ii + 1] = (fptr->Fptr)->headstart[ii]; /* incre start addr */

    if (nexthdu == 0)
       (fptr->Fptr)->headstart[1] = nblocks * 2880; /* start of the old Primary array */

    (fptr->Fptr)->headstart[nexthdu] = newstart; /* set starting addr of HDU */

    /* set default parameters for this new empty HDU */
    (fptr->Fptr)->curhdu = nexthdu;   /* we are now located at the next HDU */
    fptr->HDUposition = nexthdu;      /* we are now located at the next HDU */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[nexthdu];  
    (fptr->Fptr)->headend = (fptr->Fptr)->headstart[nexthdu];
    (fptr->Fptr)->datastart = ((fptr->Fptr)->headstart[nexthdu]) + 2880;
    (fptr->Fptr)->hdutype = IMAGE_HDU;  /* might need to be reset... */

    /* write the required header keywords */
    ffphprll(fptr, TRUE, bitpix, naxis, naxes, 0, 1, TRUE, status);

    /* redefine internal structure for this HDU */
    ffrdef(fptr, status);
    return(*status);
}